

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
               (Proxy_Function_Base **t_func,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *plist,
               Type_Conversions_State *t_conversions)

{
  int iVar1;
  const_iterator cVar2;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  __first1;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  in_RDX;
  undefined8 *in_RDI;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *types;
  pair<__gnu_cxx::__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  *in_stack_ffffffffffffff78;
  difference_type in_stack_ffffffffffffff80;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  *in_stack_ffffffffffffff88;
  undefined8 local_70;
  undefined1 local_1;
  
  Proxy_Function_Base::get_param_types((Proxy_Function_Base *)*in_RDI);
  iVar1 = Proxy_Function_Base::get_arity((Proxy_Function_Base *)*in_RDI);
  if (iVar1 == -1) {
    local_1 = false;
  }
  else {
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_ffffffffffffff78);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_ffffffffffffff78);
    cVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::begin
                      ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                       in_stack_ffffffffffffff78);
    __first1 = __gnu_cxx::
               __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
               ::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::
    mismatch<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,chaiscript::dispatch::detail::types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>(chaiscript::dispatch::Proxy_Function_Base_const*const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,chaiscript::Type_Conversions_State_const&)::_lambda(chaiscript::Boxed_Value_const&,chaiscript::Type_Info_const&)_1_>
              ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                )__first1._M_current,
               (__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                )cVar2._M_current,in_RDX,local_70);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_ffffffffffffff78);
    cVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end
                      ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                       in_stack_ffffffffffffff78);
    std::
    make_pair<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>>
              ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                *)cVar2._M_current,
               (__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
                *)in_stack_ffffffffffffff78);
    local_1 = std::operator==((pair<__gnu_cxx::__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
                               *)cVar2._M_current,in_stack_ffffffffffffff78);
  }
  return local_1;
}

Assistant:

bool types_match_except_for_arithmetic(const FuncType &t_func, const std::vector<Boxed_Value> &plist,
            const Type_Conversions_State &t_conversions)
        {
          const std::vector<Type_Info> &types = t_func->get_param_types();

          if (t_func->get_arity() == -1) return false;

          assert(plist.size() == types.size() - 1);

          return std::mismatch(plist.begin(), plist.end(),
                               types.begin()+1,
                               [&](const Boxed_Value &bv, const Type_Info &ti) {
                                 return Proxy_Function_Base::compare_type_to_param(ti, bv, t_conversions)
                                       || (bv.get_type_info().is_arithmetic() && ti.is_arithmetic());
                               }
              ) == std::make_pair(plist.end(), types.end());
        }